

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,REF_INT global0,REF_INT global1)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  uint uVar4;
  REF_CELL *ppRVar5;
  REF_INT cell;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uStackY_60;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT part;
  long local_38;
  
  ref_node = ref_subdiv->grid->node;
  uVar3 = ref_node_local(ref_node,(long)global0,&node0);
  if ((uVar3 == 0) || (uVar3 == 5)) {
    uVar4 = ref_node_local(ref_node,(long)global1,&node1);
    if ((uVar4 != 0) && (uVar4 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x61
             ,"ref_subdiv_inspect_global",(ulong)uVar4,"g2l1");
      uVar3 = uVar4;
    }
    if ((uVar4 != 5) && (uVar4 != 0)) {
      return uVar3;
    }
    if (node1 == -1 || node0 == -1) {
      return 0;
    }
    uVar3 = ref_edge_with(ref_subdiv->edge,node0,node1,&edge);
    if (uVar3 == 0) {
      uVar3 = ref_edge_part(ref_subdiv->edge,edge,&part);
      if (uVar3 == 0) {
        printf(" mark %d edge %d rank %d part %d global %d %d\n",(ulong)(uint)ref_subdiv->mark[edge]
               ,(long)edge,(ulong)(uint)ref_subdiv->grid->mpi->id,(ulong)(uint)part,global0,global1)
        ;
        ppRVar5 = ref_subdiv->grid->cell + 8;
        for (local_38 = 8; local_38 != 0x10; local_38 = local_38 + 1) {
          ref_cell = *ppRVar5;
          uVar8 = 0xffffffff;
          cell = -1;
          if (-1 < (long)node0) {
            pRVar1 = ref_cell->ref_adj;
            uVar8 = 0xffffffff;
            cell = -1;
            if (node0 < pRVar1->nnode) {
              uVar3 = pRVar1->first[node0];
              uVar8 = 0xffffffff;
              cell = -1;
              if ((long)(int)uVar3 != -1) {
                cell = pRVar1->item[(int)uVar3].ref;
                uVar8 = (ulong)uVar3;
              }
            }
          }
          while ((int)uVar8 != -1) {
            for (lVar7 = 0; (int)lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
              if (node1 == ref_cell->c2n[(long)ref_cell->size_per * (long)cell + lVar7]) {
                ref_subdiv_inspect_cell(ref_subdiv,ref_cell,cell);
              }
            }
            pRVar2 = ref_cell->ref_adj->item;
            uVar8 = (ulong)pRVar2[(int)uVar8].next;
            cell = -1;
            if (uVar8 != 0xffffffffffffffff) {
              cell = pRVar2[uVar8].ref;
            }
          }
          ppRVar5 = ref_subdiv->grid->cell + local_38 + 1;
        }
        return 0;
      }
      pcVar6 = "part";
      uStackY_60 = 100;
    }
    else {
      pcVar6 = "with";
      uStackY_60 = 99;
    }
  }
  else {
    pcVar6 = "g2l0";
    uStackY_60 = 0x60;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
         uStackY_60,"ref_subdiv_inspect_global",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,
                                             REF_INT global0, REF_INT global1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_INT node0, node1;
  REF_INT edge, part;
  REF_INT group, item, node, cell;

  RXS(ref_node_local(ref_node, global0, &node0), REF_NOT_FOUND, "g2l0");
  RXS(ref_node_local(ref_node, global1, &node1), REF_NOT_FOUND, "g2l1");
  if (REF_EMPTY == node0 || REF_EMPTY == node1) return REF_SUCCESS;
  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge), "with");
  RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "part");

  printf(" mark %d edge %d rank %d part %d global %d %d\n",
         ref_subdiv_mark(ref_subdiv, edge), edge,
         ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), part, global0, global1);

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, node, cell) {
      RSS(ref_subdiv_inspect_cell(ref_subdiv, ref_cell, cell), "insp");
    }
  }

  return REF_SUCCESS;
}